

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall
libtorrent::request_dropped_alert::~request_dropped_alert(request_dropped_alert *this)

{
  request_dropped_alert *this_local;
  
  ~request_dropped_alert(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

struct TORRENT_EXPORT request_dropped_alert final : peer_alert
	{
		// internal
		TORRENT_UNEXPORT request_dropped_alert(aux::stack_allocator& alloc, torrent_handle h
			, tcp::endpoint const& ep, peer_id const& peer_id, int block_num
			, piece_index_t piece_num);

		TORRENT_DEFINE_ALERT(request_dropped_alert, 28)

#include "libtorrent/aux_/disable_deprecation_warnings_push.hpp"
		static inline constexpr alert_category_t static_category =
			alert_category::block_progress
			| alert_category::peer
			PROGRESS_NOTIFICATION
		;
#include "libtorrent/aux_/disable_warnings_pop.hpp"

		std::string message() const override;

		int const block_index;
		piece_index_t const piece_index;
	}